

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GayBerneAtomTypesSectionParser.cpp
# Opt level: O1

void __thiscall
OpenMD::GayBerneAtomTypesSectionParser::parseLine
          (GayBerneAtomTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  AtomType *pAVar3;
  RealType dw;
  string atomTypeName;
  StringTokenizer tokenizer;
  GayBerneAdapter gba;
  string local_e0;
  double local_c0;
  RealType local_b8;
  RealType local_b0;
  RealType local_a8;
  RealType local_a0;
  double local_98;
  double local_90;
  StringTokenizer local_88;
  GayBerneAdapter local_30;
  
  paVar1 = &local_e0.field_2;
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0," ;\t\n\r","");
  StringTokenizer::StringTokenizer(&local_88,line,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  iVar2 = StringTokenizer::countTokens(&local_88);
  if (iVar2 < 7) {
    snprintf(painCave.errMsg,2000,
             "GayBerneAtomTypesSectionParser: Not enough tokens at line %d\n\tPlease note that GB atoms now require separate specification of epsilon\n\tvalues for cross (X), Side-by-Side (S), and End-to-End (E) for each\n\tellipsoid type.\n"
             ,(ulong)(uint)lineNo);
    painCave.isFatal = 1;
    simError();
  }
  else {
    local_90 = (this->options_->EnergyUnitScaling).data_;
    local_98 = (this->options_->DistanceUnitScaling).data_;
    StringTokenizer::nextToken_abi_cxx11_(&local_e0,&local_88);
    pAVar3 = ForceField::getAtomType(ff,&local_e0);
    if (pAVar3 == (AtomType *)0x0) {
      snprintf(painCave.errMsg,2000,
               "GayBerneAtomTypesSectionParser: Can not find matching AtomType %s\n\tfor this GayBerne atom type\n"
               ,local_e0._M_dataplus._M_p);
      painCave.isFatal = 1;
      simError();
    }
    else {
      local_a0 = StringTokenizer::nextTokenAsDouble(&local_88);
      local_a8 = StringTokenizer::nextTokenAsDouble(&local_88);
      local_b0 = StringTokenizer::nextTokenAsDouble(&local_88);
      local_b8 = StringTokenizer::nextTokenAsDouble(&local_88);
      local_c0 = StringTokenizer::nextTokenAsDouble(&local_88);
      dw = StringTokenizer::nextTokenAsDouble(&local_88);
      local_30.at_ = pAVar3;
      GayBerneAdapter::makeGayBerne
                (&local_30,local_a0 * local_98,local_a8 * local_98,local_b0 * local_90,
                 local_b8 * local_90,local_c0 * local_90,dw);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.delim_._M_dataplus._M_p != &local_88.delim_.field_2) {
    operator_delete(local_88.delim_._M_dataplus._M_p,
                    local_88.delim_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.tokenString_._M_dataplus._M_p != &local_88.tokenString_.field_2) {
    operator_delete(local_88.tokenString_._M_dataplus._M_p,
                    local_88.tokenString_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GayBerneAtomTypesSectionParser::parseLine(ForceField& ff,
                                                 const std::string& line,
                                                 int lineNo) {
    StringTokenizer tokenizer(line);
    int nTokens = tokenizer.countTokens();
    // in GayBerneAtomTypesSection, a line at least contains 7 tokens
    // atomTypeName   d    l    eps_X  eps_S   eps_E   dw
    if (nTokens < 7) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "GayBerneAtomTypesSectionParser: Not enough tokens at line %d\n"
          "\tPlease note that GB atoms now require separate specification of "
          "epsilon\n"
          "\tvalues for cross (X), Side-by-Side (S), and End-to-End (E) for "
          "each\n"
          "\tellipsoid type.\n",
          lineNo);
      painCave.isFatal = 1;
      simError();
    } else {
      RealType eus_            = options_.getEnergyUnitScaling();
      RealType dus_            = options_.getDistanceUnitScaling();
      std::string atomTypeName = tokenizer.nextToken();
      AtomType* atomType       = ff.getAtomType(atomTypeName);
      if (atomType != NULL) {
        RealType GB_d     = dus_ * tokenizer.nextTokenAsDouble();
        RealType GB_l     = dus_ * tokenizer.nextTokenAsDouble();
        RealType GB_eps_X = eus_ * tokenizer.nextTokenAsDouble();
        RealType GB_eps_S = eus_ * tokenizer.nextTokenAsDouble();
        RealType GB_eps_E = eus_ * tokenizer.nextTokenAsDouble();
        RealType GB_dw    = tokenizer.nextTokenAsDouble();

        GayBerneAdapter gba = GayBerneAdapter(atomType);
        gba.makeGayBerne(GB_d, GB_l, GB_eps_X, GB_eps_S, GB_eps_E, GB_dw);

      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "GayBerneAtomTypesSectionParser: Can not find matching "
                 "AtomType %s\n"
                 "\tfor this GayBerne atom type\n",
                 atomTypeName.c_str());
        painCave.isFatal = 1;
        simError();
      }
    }
  }